

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,Point *refinement,Bounds *core,Bounds *bounds)

{
  Bounds<int> *in_RCX;
  undefined4 in_EDX;
  type in_ESI;
  DynamicPoint<int,_4UL> *in_RDI;
  Bounds<int> *pBVar1;
  undefined4 in_stack_fffffffffffffe80;
  Bounds *in_stack_fffffffffffffea0;
  Bounds *in_stack_fffffffffffffea8;
  Point *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  Description *in_stack_fffffffffffffec0;
  
  Factory<diy::Link>::Registrar<diy::AMRLink>::Registrar((Registrar<diy::AMRLink> *)in_RCX);
  *(undefined ***)&in_RDI->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_> =
       &PTR_id_abi_cxx11__001be870;
  (in_RDI->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_static_data[0] = in_ESI;
  pBVar1 = (Bounds<int> *)
           ((in_RDI->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>).m_static_data + 2);
  DynamicPoint<int,_4UL>::DynamicPoint(&in_RCX->min,in_RDI);
  Bounds<int>::Bounds((Bounds<int> *)CONCAT44(in_EDX,in_stack_fffffffffffffe80),pBVar1);
  Bounds<int>::Bounds((Bounds<int> *)CONCAT44(in_EDX,in_stack_fffffffffffffe80),pBVar1);
  Description::Description
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Bounds<int>::~Bounds(in_RCX);
  Bounds<int>::~Bounds(in_RCX);
  DynamicPoint<int,_4UL>::~DynamicPoint((DynamicPoint<int,_4UL> *)0x17067f);
  std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::vector
            ((vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)
             0x17068f);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x17069f);
  return;
}

Assistant:

AMRLink(int dim, int level, Point refinement, const Bounds& core, const Bounds& bounds):
                        dim_(dim), local_ { level, refinement, core, bounds }               {}